

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

SyString * VmHttpExtractHeaderValue(SySet *pSet,char *zMime,sxu32 nByte)

{
  void *pvVar1;
  undefined8 *puVar2;
  int local_50;
  uint local_4c;
  sxu32 n;
  SyString sMime;
  SyhttpHeader *pMime;
  SyhttpHeader *aMime;
  sxu32 nByte_local;
  char *zMime_local;
  SySet *pSet_local;
  
  pvVar1 = pSet->pBase;
  local_4c = 0;
  while( true ) {
    if (pSet->nUsed <= local_4c) {
      return (SyString *)0x0;
    }
    puVar2 = (undefined8 *)((long)pvVar1 + (ulong)local_4c * 0x20);
    if (nByte == *(sxu32 *)(puVar2 + 1)) {
      local_50 = SyStrnicmp(zMime,(char *)*puVar2,*(sxu32 *)(puVar2 + 1));
    }
    else {
      local_50 = nByte - *(int *)(puVar2 + 1);
    }
    if (local_50 == 0) break;
    local_4c = local_4c + 1;
  }
  return (SyString *)(puVar2 + 2);
}

Assistant:

static SyString * VmHttpExtractHeaderValue(SySet *pSet, const char *zMime, sxu32 nByte)
 {
	 SyhttpHeader *aMime, *pMime;
	 SyString sMime;
	 sxu32 n;
	 SyStringInitFromBuf(&sMime, zMime, nByte);
	 /* Point to the MIME entries */
	 aMime = (SyhttpHeader *)SySetBasePtr(pSet);
	 /* Perform the lookup */
	 for( n = 0 ; n < SySetUsed(pSet) ; ++n ){
		 pMime = &aMime[n];
		 if( SyStringCmp(&sMime, &pMime->sName, SyStrnicmp) == 0 ){
			 /* Header found, return it's associated value */
			 return &pMime->sValue;
		 }
	 }
	 /* No such MIME header */
	 return 0;
 }